

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool process_args(int argc,char **argv,conf_t *config)

{
  char *pcVar1;
  int i;
  int iVar2;
  
  iVar2 = 1;
  do {
    if (argc <= iVar2) {
      return (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
    pcVar1 = argv[iVar2];
    if (*pcVar1 == '-') {
      if ((pcVar1[1] == 'h') && (pcVar1[2] == '\0')) {
        return false;
      }
      if ((pcVar1[1] == 'v') && (pcVar1[2] == '\0')) {
        config->verbose = true;
      }
      else if ((pcVar1[1] == 's') && (pcVar1[2] == '\0')) {
        config->simulate = true;
      }
      else {
        if ((pcVar1[1] != 'o') || (pcVar1[2] != '\0')) goto LAB_00103877;
        if (argc + -1 <= iVar2) {
          return false;
        }
        iVar2 = iVar2 + 1;
        std::__cxx11::string::assign((char *)&config->output_path);
      }
    }
    else {
LAB_00103877:
      std::vector<char_*,_std::allocator<char_*>_>::push_back(&config->files,argv + iVar2);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

bool process_args(int argc, char **argv, conf_t &config)
{
	for (int i = 1; i < argc; ++i) {
		if (!strcmp(argv[i], "-h")) {
			return false;
		} else if (!strcmp(argv[i], "-v")) {
			config.verbose = true;
		} else if (!strcmp(argv[i], "-s")) {
			config.simulate = true;
		} else if (!strcmp(argv[i], "-o")) {
			if (i < argc - 1) {
				config.output_path = argv[++i];
			} else {
				return false;
			}
		} else {
			config.files.push_back(argv[i]);
		}
	}

	if (config.files.size() > 0) {
		return true;
	} else {
		return false;
	}
}